

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WindowDelete(sqlite3 *db,Window *p)

{
  if (p != (Window *)0x0) {
    if (p->ppThis != (Window **)0x0) {
      *p->ppThis = p->pNextWin;
      if (p->pNextWin != (Window *)0x0) {
        p->pNextWin->ppThis = p->ppThis;
      }
      p->ppThis = (Window **)0x0;
    }
    if (p->pFilter != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,p->pFilter);
    }
    if (p->pPartition != (ExprList *)0x0) {
      exprListDeleteNN(db,p->pPartition);
    }
    if (p->pOrderBy != (ExprList *)0x0) {
      exprListDeleteNN(db,p->pOrderBy);
    }
    if (p->pEnd != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,p->pEnd);
    }
    if (p->pStart != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,p->pStart);
    }
    if (p->zName != (char *)0x0) {
      sqlite3DbFreeNN(db,p->zName);
    }
    if (p->zBase != (char *)0x0) {
      sqlite3DbFreeNN(db,p->zBase);
    }
    sqlite3DbFreeNN(db,p);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowDelete(sqlite3 *db, Window *p){
  if( p ){
    sqlite3WindowUnlinkFromSelect(p);
    sqlite3ExprDelete(db, p->pFilter);
    sqlite3ExprListDelete(db, p->pPartition);
    sqlite3ExprListDelete(db, p->pOrderBy);
    sqlite3ExprDelete(db, p->pEnd);
    sqlite3ExprDelete(db, p->pStart);
    sqlite3DbFree(db, p->zName);
    sqlite3DbFree(db, p->zBase);
    sqlite3DbFree(db, p);
  }
}